

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

void __thiscall procxx::pipe_streambuf::~pipe_streambuf(pipe_streambuf *this)

{
  *(undefined ***)&this->super_pipe_ostreambuf = &PTR__pipe_streambuf_001673c0;
  flush(this);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->out_buffer_).super__Vector_base<char,_std::allocator<char>_>);
  pipe_t::~pipe_t(&this->stdin_pipe_);
  pipe_ostreambuf::~pipe_ostreambuf(&this->super_pipe_ostreambuf);
  return;
}

Assistant:

~pipe_streambuf() { flush(); }